

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-netpack.c
# Opt level: O2

uncomplete * find_uncomplete(queue *q,int fd)

{
  uncomplete *puVar1;
  uncomplete *puVar2;
  ulong uVar3;
  
  if (q != (queue *)0x0) {
    uVar3 = (ulong)(((uint)fd >> 0xc) + fd + (fd >> 0x18) & 0xfff);
    puVar2 = q->hash[uVar3];
    if (puVar2 != (uncomplete *)0x0) {
      if ((puVar2->pack).id == fd) {
        puVar1 = (uncomplete *)(q->hash + (uVar3 - 2));
      }
      else {
        do {
          puVar1 = puVar2;
          puVar2 = puVar1->next;
          if (puVar2 == (uncomplete *)0x0) {
            return (uncomplete *)0x0;
          }
        } while ((puVar2->pack).id != fd);
      }
      puVar1->next = puVar2->next;
      return puVar2;
    }
  }
  return (uncomplete *)0x0;
}

Assistant:

static struct uncomplete *
find_uncomplete(struct queue *q, int fd) {
	if (q == NULL)
		return NULL;
	int h = hash_fd(fd);
	struct uncomplete * uc = q->hash[h];
	if (uc == NULL)
		return NULL;
	if (uc->pack.id == fd) {
		q->hash[h] = uc->next;
		return uc;
	}
	struct uncomplete * last = uc;
	while (last->next) {
		uc = last->next;
		if (uc->pack.id == fd) {
			last->next = uc->next;
			return uc;
		}
		last = uc;
	}
	return NULL;
}